

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sftp.c
# Opt level: O1

ssize_t sftp_bin2attr(LIBSSH2_SFTP_ATTRIBUTES *attrs,uchar *p,size_t data_len)

{
  int iVar1;
  ssize_t sVar2;
  uint uVar3;
  uint32_t uid;
  uint32_t gid;
  uint32_t extended_count;
  uint32_t flags;
  string_buf buf;
  uchar *edata;
  size_t edata_len;
  size_t local_70;
  uchar *local_68;
  uint local_60;
  uint32_t local_5c;
  string_buf local_58;
  uchar *local_40;
  size_t local_38;
  
  local_5c = 0;
  local_58.data = p;
  local_58.dataptr = p;
  local_58.len = data_len;
  iVar1 = _libssh2_get_u32(&local_58,&local_5c);
  sVar2 = -0x26;
  if ((iVar1 == 0) &&
     ((attrs->flags = (ulong)local_5c, (local_5c & 1) == 0 ||
      (iVar1 = _libssh2_get_u64(&local_58,&attrs->filesize), iVar1 == 0)))) {
    if ((attrs->flags & 2) != 0) {
      local_70._0_4_ = 0;
      local_68._0_4_ = 0;
      iVar1 = _libssh2_get_u32(&local_58,(uint32_t *)&local_70);
      if (iVar1 != 0) {
        return -0x26;
      }
      iVar1 = _libssh2_get_u32(&local_58,(uint32_t *)&local_68);
      if (iVar1 != 0) {
        return -0x26;
      }
      attrs->uid = (ulong)(uint)local_70;
      attrs->gid = (ulong)(uint)local_68;
    }
    if ((attrs->flags & 4) != 0) {
      iVar1 = _libssh2_get_u32(&local_58,(uint32_t *)&local_70);
      if (iVar1 != 0) {
        return -0x26;
      }
      attrs->permissions = (ulong)(uint)local_70;
    }
    if ((attrs->flags & 8) != 0) {
      iVar1 = _libssh2_get_u32(&local_58,(uint32_t *)&local_70);
      if (iVar1 != 0) {
        return -0x26;
      }
      iVar1 = _libssh2_get_u32(&local_58,(uint32_t *)&local_68);
      if (iVar1 != 0) {
        return -0x26;
      }
      attrs->atime = (ulong)(uint)local_70;
      attrs->mtime = (ulong)(uint)local_68;
    }
    if ((attrs->flags & 0x80000000) != 0) {
      iVar1 = _libssh2_get_u32(&local_58,&local_60);
      if (iVar1 != 0) {
        return -0x26;
      }
      if (local_60 != 0) {
        uVar3 = 0;
        do {
          iVar1 = _libssh2_get_string(&local_58,&local_68,&local_70);
          if (iVar1 != 0) {
            return -0x26;
          }
          iVar1 = _libssh2_get_string(&local_58,&local_40,&local_38);
          if (iVar1 != 0) {
            return -0x26;
          }
          uVar3 = uVar3 + 1;
        } while (uVar3 < local_60);
      }
    }
    sVar2 = (long)local_58.dataptr - (long)local_58.data;
  }
  return sVar2;
}

Assistant:

static ssize_t
sftp_bin2attr(LIBSSH2_SFTP_ATTRIBUTES *attrs, const unsigned char *p,
              size_t data_len)
{
    struct string_buf buf;
    uint32_t flags = 0;
    buf.data = (unsigned char *)p;
    buf.dataptr = buf.data;
    buf.len = data_len;

    if(_libssh2_get_u32(&buf, &flags)) {
        return LIBSSH2_ERROR_BUFFER_TOO_SMALL;
    }
    attrs->flags = flags;

    if(attrs->flags & LIBSSH2_SFTP_ATTR_SIZE) {
        if(_libssh2_get_u64(&buf, &(attrs->filesize))) {
            return LIBSSH2_ERROR_BUFFER_TOO_SMALL;
        }
    }

    if(attrs->flags & LIBSSH2_SFTP_ATTR_UIDGID) {
        uint32_t uid = 0;
        uint32_t gid = 0;
        if(_libssh2_get_u32(&buf, &uid) ||
           _libssh2_get_u32(&buf, &gid)) {
            return LIBSSH2_ERROR_BUFFER_TOO_SMALL;
        }
        attrs->uid = uid;
        attrs->gid = gid;
    }

    if(attrs->flags & LIBSSH2_SFTP_ATTR_PERMISSIONS) {
        uint32_t permissions;
        if(_libssh2_get_u32(&buf, &permissions)) {
            return LIBSSH2_ERROR_BUFFER_TOO_SMALL;
        }
        attrs->permissions = permissions;
    }

    if(attrs->flags & LIBSSH2_SFTP_ATTR_ACMODTIME) {
        uint32_t atime;
        uint32_t mtime;
        if(_libssh2_get_u32(&buf, &atime) ||
           _libssh2_get_u32(&buf, &mtime)) {
            return LIBSSH2_ERROR_BUFFER_TOO_SMALL;
        }
        attrs->atime = atime;
        attrs->mtime = mtime;
    }

    /* Parse extended data, if present, to avoid stream parsing errors */
    if(attrs->flags & LIBSSH2_SFTP_ATTR_EXTENDED) {
        uint32_t extended_count;
        uint32_t i;
        size_t etype_len;
        unsigned char *etype;
        size_t edata_len;
        unsigned char *edata;

        if(_libssh2_get_u32(&buf, &extended_count)) {
            return LIBSSH2_ERROR_BUFFER_TOO_SMALL;
        }

        for(i = 0; i < extended_count; ++i) {
            if(_libssh2_get_string(&buf, &etype, &etype_len) ||
               _libssh2_get_string(&buf, &edata, &edata_len)) {
                return LIBSSH2_ERROR_BUFFER_TOO_SMALL;
            }
        }
    }

    return buf.dataptr - buf.data;
}